

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::Value,_8UL>::clear
          (ArrayWithPreallocation<soul::Value,_8UL> *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < this->numActive; uVar2 = uVar2 + 1) {
    soul::Value::~Value((Value *)((long)(&(this->items->allocatedData).allocatedData + -1) + lVar1))
    ;
    lVar1 = lVar1 + 0x40;
  }
  this->numActive = 0;
  freeIfHeapAllocated(this);
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }